

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

TypeRef clickhouse::Type::CreateNullable(TypeRef *nested_type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Type *in_RSI;
  element_type *in_RDI;
  TypeRef TVar1;
  TypeRef *type;
  element_type *this;
  uint3 in_stack_ffffffffffffffec;
  Code code;
  Type *this_00;
  
  code = (Code)in_stack_ffffffffffffffec;
  this = in_RDI;
  this_00 = in_RSI;
  operator_new(0x10);
  Type(this_00,code);
  std::shared_ptr<clickhouse::Type>::shared_ptr<clickhouse::Type,void>
            ((shared_ptr<clickhouse::Type> *)this,in_RSI);
  std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x24585e);
  std::shared_ptr<clickhouse::Type>::operator=
            ((shared_ptr<clickhouse::Type> *)this,(shared_ptr<clickhouse::Type> *)in_RSI);
  TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TypeRef)TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateNullable(TypeRef nested_type) {
    TypeRef type(new Type(Type::Nullable));
    type->nullable_->nested_type = nested_type;
    return type;
}